

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_collection_size_test.cc
# Opt level: O0

int main(void)

{
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *this;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pNVar4;
  ostream *poVar5;
  undefined1 local_180 [8];
  Node<label::StringLabel> t;
  iterator __end1;
  iterator __begin1;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *__range1
  ;
  int computed_number_nodes;
  int computed_number_trees;
  BracketNotationParser<label::StringLabel> bnp;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  trees_collection;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string file_path;
  int correct_number_nodes;
  int correct_number_trees;
  
  file_path.field_2._12_4_ = 0x22;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"parser_collection_size_test_data.txt",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
  vector((vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *
         )((long)&bnp.kMatchRightBracket.field_2 + 8));
  parser::BracketNotationParser<label::StringLabel>::BracketNotationParser
            ((BracketNotationParser<label::StringLabel> *)&computed_number_nodes);
  parser::BracketNotationParser<label::StringLabel>::parse_collection
            ((BracketNotationParser<label::StringLabel> *)&computed_number_nodes,
             (vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              *)((long)&bnp.kMatchRightBracket.field_2 + 8),(string *)local_38);
  sVar3 = std::
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
          size((vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                *)((long)&bnp.kMatchRightBracket.field_2 + 8));
  __range1._0_4_ = 0;
  this = (vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *
         )((long)&bnp.kMatchRightBracket.field_2 + 8);
  __end1 = std::
           vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ::begin(this);
  t.label_.label_.field_2._8_8_ =
       std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
       ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
                                *)((long)&t.label_.label_.field_2 + 8));
    if (!bVar1) break;
    pNVar4 = __gnu_cxx::
             __normal_iterator<node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
             ::operator*(&__end1);
    node::Node<label::StringLabel>::Node((Node<label::StringLabel> *)local_180,pNVar4);
    iVar2 = node::Node<label::StringLabel>::get_tree_size((Node<label::StringLabel> *)local_180);
    __range1._0_4_ = iVar2 + (int)__range1;
    node::Node<label::StringLabel>::~Node((Node<label::StringLabel> *)local_180);
    __gnu_cxx::
    __normal_iterator<node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
    ::operator++(&__end1);
  }
  if ((int)sVar3 == 3) {
    if (file_path.field_2._12_4_ == (int)__range1) {
      correct_number_nodes = 0;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Incorrect number of nodes in collection: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)__range1);
      poVar5 = std::operator<<(poVar5," instead of ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,file_path.field_2._12_4_);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      correct_number_nodes = -1;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Incorrect number of trees in collection: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)sVar3);
    poVar5 = std::operator<<(poVar5," instead of ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    correct_number_nodes = -1;
  }
  parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser
            ((BracketNotationParser<label::StringLabel> *)&computed_number_nodes);
  std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
  ~vector((vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           *)((long)&bnp.kMatchRightBracket.field_2 + 8));
  std::__cxx11::string::~string((string *)local_38);
  return correct_number_nodes;
}

Assistant:

int main() {
  using Label = label::StringLabel;

  // Correct result - currently hard-coded here.
  int correct_number_trees = 3;
  int correct_number_nodes = 1 + 13 + 20;

  std::string file_path = "parser_collection_size_test_data.txt";

  // Create the container to store all trees.
  std::vector<node::Node<Label>> trees_collection;

  parser::BracketNotationParser<Label> bnp;
  bnp.parse_collection(trees_collection, file_path);

  int computed_number_trees = trees_collection.size();
  int computed_number_nodes = 0;
  for (auto t : trees_collection) {
    computed_number_nodes += t.get_tree_size();
  }

  if (correct_number_trees != computed_number_trees) {
    std::cerr << "Incorrect number of trees in collection: " << computed_number_trees << " instead of " << correct_number_trees << std::endl;
    return -1;
  }

  if (correct_number_nodes != computed_number_nodes) {
    std::cerr << "Incorrect number of nodes in collection: " << computed_number_nodes << " instead of " << correct_number_nodes << std::endl;
    return -1;
  }

  return 0;
}